

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Instance::writeTo(Instance *this,BinaryWriter *binary)

{
  BinaryWriter *in_RDI;
  affine3f *in_stack_ffffffffffffffa8;
  SP *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  BinaryWriter::write<pbrt::math::affine3f>(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Object,void>
            ((shared_ptr<pbrt::Entity> *)in_RDI,
             (shared_ptr<pbrt::Object> *)in_stack_ffffffffffffffa8);
  BinaryWriter::serialize
            ((BinaryWriter *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0);
  BinaryWriter::write<int>(in_RDI,(int *)in_stack_ffffffffffffffa8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x1119d0);
  return 4;
}

Assistant:

int Instance::writeTo(BinaryWriter &binary) 
  {
    binary.write(xfm);
    binary.write(binary.serialize(object));
    return TYPE_INSTANCE;
  }